

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::BindingImagesTest::BindingImagesTest(BindingImagesTest *this,Context *context)

{
  BindingImageTest::BindingImageTest
            (&this->super_BindingImageTest,context,"binding_images",
             "Test verifies binding of images");
  (this->super_BindingImageTest).super_GLSLTestBase.super_TestBase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__BindingImagesTest_01dcdc50;
  (this->m_goku_texture).m_id = 0;
  (this->m_goku_texture).m_context = context;
  (this->m_goku_texture).m_texture_type = TEX_2D;
  (this->m_vegeta_texture).m_id = 0;
  (this->m_vegeta_texture).m_context = context;
  (this->m_vegeta_texture).m_texture_type = TEX_2D;
  (this->m_trunks_texture).m_id = 0;
  (this->m_trunks_texture).m_context = context;
  (this->m_trunks_texture).m_texture_type = TEX_2D;
  (this->m_goku_buffer).m_id = 0;
  (this->m_goku_buffer).m_context = context;
  (this->m_goku_buffer).m_target = 0;
  (this->m_vegeta_buffer).m_id = 0;
  (this->m_vegeta_buffer).m_context = context;
  (this->m_vegeta_buffer).m_target = 0;
  (this->m_trunks_buffer).m_id = 0;
  (this->m_trunks_buffer).m_context = context;
  (this->m_trunks_buffer).m_target = 0;
  return;
}

Assistant:

BindingImagesTest::BindingImagesTest(deqp::Context& context)
	: BindingImageTest(context, "binding_images", "Test verifies binding of images")
	, m_goku_texture(context)
	, m_vegeta_texture(context)
	, m_trunks_texture(context)
	, m_goku_buffer(context)
	, m_vegeta_buffer(context)
	, m_trunks_buffer(context)
{
	/* Nothing to be done here */
}